

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_lsrkstep.c
# Opt level: O1

int lsrkStep_ReInit_Commons(void *arkode_mem,ARKRhsFn rhs,sunrealtype t0,N_Vector y0)

{
  int iVar1;
  int line;
  int error_code;
  char *msgfmt;
  ARKodeLSRKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeLSRKStepMem local_40;
  ARKodeMem local_38;
  
  iVar1 = lsrkStep_AccessARKODEStepMem(arkode_mem,"lsrkStep_ReInit_Commons",&local_38,&local_40);
  if (iVar1 == 0) {
    if (local_38->MallocDone == 0) {
      msgfmt = "Attempt to call before ARKodeInit.";
      iVar1 = -0x17;
      error_code = -0x17;
      line = 0xf3;
    }
    else if (rhs == (ARKRhsFn)0x0) {
      msgfmt = "Must specify at least one of fe, fi (both NULL).";
      iVar1 = -0x16;
      error_code = -0x16;
      line = 0xfb;
    }
    else {
      if (y0 != (N_Vector)0x0) {
        local_40->fe = rhs;
        iVar1 = arkInit((ARKodeMem)arkode_mem,t0,y0,0);
        if (iVar1 != 0) {
          arkProcessError(local_38,iVar1,0x10f,"lsrkStep_ReInit_Commons",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep.c"
                          ,"Unable to initialize main ARKODE infrastructure");
          return iVar1;
        }
        local_40->dom_eig_nst = 0;
        local_40->nfe = 0;
        local_40->dom_eig_num_evals = 0;
        local_40->stage_max = 0;
        local_40->spectral_radius_max = 0.0;
        local_40->spectral_radius_min = 0.0;
        local_40->dom_eig_update = 1;
        local_40->dom_eig_is_current = 0;
        return 0;
      }
      msgfmt = "y0 = NULL illegal.";
      iVar1 = -0x16;
      error_code = -0x16;
      line = 0x103;
    }
    arkProcessError(local_38,error_code,line,"lsrkStep_ReInit_Commons",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep.c"
                    ,msgfmt);
  }
  return iVar1;
}

Assistant:

int lsrkStep_ReInit_Commons(void* arkode_mem, ARKRhsFn rhs, sunrealtype t0,
                            N_Vector y0)
{
  ARKodeMem ark_mem;
  ARKodeLSRKStepMem step_mem;
  int retval;

  /* access ARKodeLSRKStepMem structure */
  retval = lsrkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem,
                                        &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  /* Check if ark_mem was allocated */
  if (ark_mem->MallocDone == SUNFALSE)
  {
    arkProcessError(ark_mem, ARK_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MALLOC);
    return ARK_NO_MALLOC;
  }

  /* Check that rhs is supplied */
  if (rhs == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_F);
    return ARK_ILL_INPUT;
  }

  /* Check for legal input parameters */
  if (y0 == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_Y0);
    return ARK_ILL_INPUT;
  }

  /* Copy the input parameters into ARKODE state */
  step_mem->fe = rhs;

  /* Initialize main ARKODE infrastructure */
  retval = arkInit(arkode_mem, t0, y0, FIRST_INIT);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Unable to initialize main ARKODE infrastructure");
    return retval;
  }

  /* Initialize all the counters, flags and stats */
  step_mem->nfe                 = 0;
  step_mem->dom_eig_num_evals   = 0;
  step_mem->stage_max           = 0;
  step_mem->spectral_radius_max = 0;
  step_mem->spectral_radius_min = 0;
  step_mem->dom_eig_nst         = 0;
  step_mem->dom_eig_update      = SUNTRUE;
  step_mem->dom_eig_is_current  = SUNFALSE;

  return ARK_SUCCESS;
}